

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O0

void __thiscall basisu::basisu_backend::basisu_backend(basisu_backend *this)

{
  long in_RDI;
  basisu_backend *this_00;
  basisu_backend_output *in_stack_ffffffffffffffc0;
  
  basisu_backend_params::basisu_backend_params((basisu_backend_params *)0x491295);
  vector<basisu::basisu_backend_slice_desc>::vector
            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x20));
  basisu_backend_output::basisu_backend_output(in_stack_ffffffffffffffc0);
  vector<basisu::etc1_endpoint_palette_entry>::vector
            ((vector<basisu::etc1_endpoint_palette_entry> *)(in_RDI + 0xa0));
  vector<basisu::etc1_selector_palette_entry>::vector
            ((vector<basisu::etc1_selector_palette_entry> *)(in_RDI + 0xb0));
  vector<basisu::basisu_backend::etc1_global_selector_cb_entry_desc>::vector
            ((vector<basisu::basisu_backend::etc1_global_selector_cb_entry_desc> *)(in_RDI + 0xc0));
  vector<basisu::vector2D<basisu::encoder_block>_>::vector
            ((vector<basisu::vector2D<basisu::encoder_block>_> *)(in_RDI + 0xd0));
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 0xe0));
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 0xf0));
  vector<bool>::vector((vector<bool> *)(in_RDI + 0x100));
  vector<bool>::vector((vector<bool> *)(in_RDI + 0x110));
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 0x120));
  this_00 = (basisu_backend *)(in_RDI + 0x130);
  vector<unsigned_int>::vector((vector<unsigned_int> *)this_00);
  clear(this_00);
  return;
}

Assistant:

basisu_backend::basisu_backend()
	{
		clear();
	}